

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlParseEntity(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  xmlDocPtr doc;
  PyObject *pPVar2;
  char *filename;
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlParseEntity");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlParseEntity",&local_18);
    if (iVar1 != 0) {
      doc = (xmlDocPtr)xmlParseEntity(local_18);
      pPVar2 = libxml_xmlDocPtrWrap(doc);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseEntity(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    char * filename;

    if (libxml_deprecationWarning("xmlParseEntity") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:xmlParseEntity", &filename))
        return(NULL);

    c_retval = xmlParseEntity(filename);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}